

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvKrylovDemo_prec.c
# Opt level: O0

int f(sunrealtype t,N_Vector c,N_Vector cdot,void *user_data)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  WebData in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunrealtype in_XMM0_Qa;
  WebData wdata;
  sunrealtype *cdotdata;
  sunrealtype *cdata;
  sunrealtype dy;
  sunrealtype dx;
  sunrealtype *fsave;
  sunrealtype *coy;
  sunrealtype *cox;
  sunrealtype y;
  sunrealtype x;
  sunrealtype dcyui;
  sunrealtype dcyli;
  sunrealtype dcxui;
  sunrealtype dcxli;
  int idyl;
  int idyu;
  int jy;
  int iyoff;
  int mxns;
  int ns;
  int jx;
  int idxu;
  int idxl;
  int ici;
  int ic;
  int i;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_48;
  int local_38;
  int local_24;
  
  lVar7 = N_VGetArrayPointer(in_RDI);
  lVar8 = N_VGetArrayPointer(in_RSI);
  iVar3 = in_RDX->ns;
  iVar4 = in_RDX->mxns;
  dVar1 = in_RDX->dx;
  dVar2 = in_RDX->dy;
  for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
    local_c4 = iVar4;
    if (local_48 == 5) {
      local_c4 = -iVar4;
    }
    local_c8 = iVar4;
    if (local_48 == 0) {
      local_c8 = -iVar4;
    }
    for (local_38 = 0; local_38 < 6; local_38 = local_38 + 1) {
      iVar5 = iVar4 * local_48 + iVar3 * local_38;
      WebRates((double)local_38 * dVar1,(double)local_48 * dVar2,in_XMM0_Qa,
               (sunrealtype *)(lVar7 + (long)iVar5 * 8),in_RDX->fsave + iVar5,in_RDX);
      local_cc = iVar3;
      if (local_38 == 5) {
        local_cc = -iVar3;
      }
      local_d0 = iVar3;
      if (local_38 == 0) {
        local_d0 = -iVar3;
      }
      for (local_24 = 1; local_24 <= iVar3; local_24 = local_24 + 1) {
        iVar6 = iVar5 + local_24 + -1;
        *(double *)(lVar8 + (long)iVar6 * 8) =
             in_RDX->coy[local_24 + -1] *
             ((*(double *)(lVar7 + (long)(iVar6 + local_c4) * 8) -
              *(double *)(lVar7 + (long)iVar6 * 8)) -
             (*(double *)(lVar7 + (long)iVar6 * 8) -
             *(double *)(lVar7 + (long)(iVar6 - local_c8) * 8))) +
             in_RDX->cox[local_24 + -1] *
             ((*(double *)(lVar7 + (long)(iVar6 + local_cc) * 8) -
              *(double *)(lVar7 + (long)iVar6 * 8)) -
             (*(double *)(lVar7 + (long)iVar6 * 8) -
             *(double *)(lVar7 + (long)(iVar6 - local_d0) * 8))) + in_RDX->fsave[iVar6];
      }
    }
  }
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector c, N_Vector cdot, void* user_data)
{
  int i, ic, ici, idxl, idxu, jx, ns, mxns, iyoff, jy, idyu, idyl;
  sunrealtype dcxli, dcxui, dcyli, dcyui, x, y, *cox, *coy, *fsave, dx, dy;
  sunrealtype *cdata, *cdotdata;
  WebData wdata;

  wdata    = (WebData)user_data;
  cdata    = N_VGetArrayPointer(c);
  cdotdata = N_VGetArrayPointer(cdot);

  mxns  = wdata->mxns;
  ns    = wdata->ns;
  fsave = wdata->fsave;
  cox   = wdata->cox;
  coy   = wdata->coy;
  mxns  = wdata->mxns;
  dx    = wdata->dx;
  dy    = wdata->dy;

  for (jy = 0; jy < MY; jy++)
  {
    y     = jy * dy;
    iyoff = mxns * jy;
    idyu  = (jy == MY - 1) ? -mxns : mxns;
    idyl  = (jy == 0) ? -mxns : mxns;
    for (jx = 0; jx < MX; jx++)
    {
      x  = jx * dx;
      ic = iyoff + ns * jx;
      /* Get interaction rates at one point (x,y). */
      WebRates(x, y, t, cdata + ic, fsave + ic, wdata);
      idxu = (jx == MX - 1) ? -ns : ns;
      idxl = (jx == 0) ? -ns : ns;
      for (i = 1; i <= ns; i++)
      {
        ici = ic + i - 1;
        /* Do differencing in y. */
        dcyli = cdata[ici] - cdata[ici - idyl];
        dcyui = cdata[ici + idyu] - cdata[ici];
        /* Do differencing in x. */
        dcxli = cdata[ici] - cdata[ici - idxl];
        dcxui = cdata[ici + idxu] - cdata[ici];
        /* Collect terms and load cdot elements. */
        cdotdata[ici] = coy[i - 1] * (dcyui - dcyli) +
                        cox[i - 1] * (dcxui - dcxli) + fsave[ici];
      }
    }
  }

  return (0);
}